

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O3

TrieNode<unsigned_char> * pseudo_sample<unsigned_char>(uchar **strings,size_t n)

{
  byte bVar1;
  ulong uVar2;
  TrieNode<unsigned_char> *__s;
  TrieNode<unsigned_char> *__s_00;
  byte *pbVar3;
  long lVar4;
  ulong uVar5;
  TrieNode<unsigned_char> *pTVar6;
  ulong uVar7;
  
  __s = (TrieNode<unsigned_char> *)operator_new(0x820);
  memset(__s,0,0x820);
  if (n != 0) {
    lVar4 = 0x3857;
    uVar7 = 0;
    do {
      pbVar3 = strings[uVar7];
      pTVar6 = __s;
      if (pbVar3 == (byte *)0x0) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x26,"unsigned char get_char(unsigned char *, size_t)");
      }
      while( true ) {
        bVar1 = *pbVar3;
        uVar5 = (ulong)bVar1;
        if (uVar5 == 0) break;
        uVar2 = (pTVar6->is_trie).super__Base_bitset<4UL>._M_w[bVar1 >> 6];
        if ((uVar2 >> (uVar5 & 0x3f) & 1) == 0) {
          (pTVar6->is_trie).super__Base_bitset<4UL>._M_w[bVar1 >> 6] = uVar2 | 1L << (bVar1 & 0x3f);
          __s_00 = (TrieNode<unsigned_char> *)operator_new(0x820);
          memset(__s_00,0,0x820);
          (pTVar6->buckets)._M_elems[uVar5] = __s_00;
          lVar4 = lVar4 + -1;
          if (lVar4 == 0) {
            return __s;
          }
        }
        else {
          __s_00 = (TrieNode<unsigned_char> *)(pTVar6->buckets)._M_elems[uVar5];
        }
        pbVar3 = pbVar3 + 1;
        pTVar6 = __s_00;
        if (__s_00 == (TrieNode<unsigned_char> *)0x0) {
          __assert_fail("node",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/burstsort.cpp"
                        ,0xcb,
                        "TrieNode<CharT> *pseudo_sample(unsigned char **, size_t) [CharT = unsigned char]"
                       );
        }
      }
      uVar7 = uVar7 + 0x2000;
    } while (uVar7 < n);
  }
  return __s;
}

Assistant:

static TrieNode<CharT>*
pseudo_sample(unsigned char** strings, size_t n)
{
	// Limit the maximum number of nodes to whatever fits in 30 megabytes.
	debug()<<__func__<<"(): sampling "<<n/8192<<" strings ...\n";
	size_t max_nodes = 30000000/sizeof(TrieNode<CharT>);
	TrieNode<CharT>* root = new TrieNode<CharT>;
	for (size_t i=0; i < n; i += 8192) {
		unsigned char* str = strings[i];
		size_t depth = 0;
		TrieNode<CharT>* node = root;
		while (true) {
			CharT c = get_char<CharT>(str, depth);
			if (is_end(c)) break;
			depth += sizeof(CharT);
			if (not node->is_trie[c]) {
				node->is_trie[c] = true;
				node->buckets[c] = new TrieNode<CharT>;
				if (--max_nodes==0) goto finish;
			}
			node = static_cast<TrieNode<CharT>*>(node->buckets[c]);
			assert(node);
		}
	}
finish:
	debug()<<"   Sampling done, created "
	       <<(30000000/sizeof(TrieNode<CharT>))-max_nodes<<" nodes.\n";
	return root;
}